

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall
llvm::detail::IEEEFloat::IEEEFloat(IEEEFloat *this,fltSemantics *ourSemantics,integerPart value)

{
  Significand *pSVar1;
  
  initialize(this,ourSemantics);
  this->field_0x12 = this->field_0x12 & 0xf0 | 2;
  zeroSignificand(this);
  this->exponent = (short)ourSemantics->precision + -1;
  if (this->semantics->precision - 0x40 < 0xffffff80) {
    pSVar1 = (Significand *)(this->significand).parts;
  }
  else {
    pSVar1 = &this->significand;
  }
  pSVar1->part = value;
  normalize(this,rmNearestTiesToEven,lfExactlyZero);
  return;
}

Assistant:

IEEEFloat::IEEEFloat(const fltSemantics &ourSemantics, integerPart value) {
  initialize(&ourSemantics);
  sign = 0;
  category = fcNormal;
  zeroSignificand();
  exponent = ourSemantics.precision - 1;
  significandParts()[0] = value;
  normalize(rmNearestTiesToEven, lfExactlyZero);
}